

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O3

Vec_Wrd_t * Bdc_SpfdDecomposeTest__(Vec_Int_t **pvWeights)

{
  word t;
  long lVar1;
  Vec_Int_t *__ptr;
  int iVar2;
  int iVar3;
  Bdc_Ent_t *p;
  ulong uVar4;
  Vec_Wrd_t *pVVar5;
  word *pwVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  uint *puVar9;
  ulong uVar10;
  FILE *pFVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  Bdc_Ent_t *pBVar16;
  Bdc_Ent_t *pBVar17;
  ulong uVar18;
  int iVar19;
  Bdc_Ent_t *pBVar20;
  ulong uVar21;
  long lVar22;
  timespec ts;
  ulong local_f8;
  timespec local_e8;
  Vec_Int_t *local_d8;
  Vec_Int_t *local_d0;
  Vec_Wrd_t *local_c8;
  Bdc_Ent_t *local_c0;
  long local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  Bdc_Ent_t *local_90;
  Bdc_Ent_t *local_88;
  Vec_Int_t **local_80;
  ulong local_78;
  Bdc_Ent_t *local_70;
  long local_68;
  long local_60;
  Bdc_Ent_t *local_58;
  ulong local_50;
  Bdc_Ent_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_80 = pvWeights;
  iVar2 = clock_gettime(3,&local_e8);
  if (iVar2 < 0) {
    local_a0 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_e8.tv_nsec),8);
    local_a0 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_e8.tv_sec * -1000000;
  }
  printf("Allocating %.2f MB of internal memory.\n",0x40b65a0bc0000000);
  p = (Bdc_Ent_t *)calloc(250000000,0x18);
  *(undefined4 *)p = 0xffffffff;
  *(undefined4 *)&p->field_0x4 = 0xffffffff;
  p->iNext = -1;
  p->iList = -1;
  p->Truth = 0xffffffffffffffff;
  p->iList = 0;
  uVar4 = 0xffffffffffffffe8;
  do {
    *(undefined4 *)((long)&p[1].iList + uVar4) = 0;
    uVar4 = uVar4 + 0x18;
  } while (uVar4 < 0x165a0bbe8);
  lVar12 = 0;
  uVar14 = 1;
  printf("Added %d + %d + 0 = %d. Total = %8d.\n",0,0,0,1);
  pVVar5 = (Vec_Wrd_t *)malloc(0x10);
  pVVar5->nCap = 250000000;
  pwVar6 = (word *)calloc(1,2000000000);
  pVVar5->pArray = pwVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 250000000;
  piVar8 = (int *)calloc(1,1000000000);
  pVVar7->pArray = piVar8;
  pVVar5->nSize = 0;
  pVVar7->nSize = 0;
  local_d0 = pVVar7;
  local_c8 = pVVar5;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x10;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(0x40);
  pVVar7->pArray = piVar8;
  local_d8 = pVVar7;
  Vec_IntPush(pVVar7,1);
  local_c0 = p + 1;
  lVar22 = 0x1fffffff;
  do {
    *(ulong *)local_c0 = (*(ulong *)local_c0 & 0xe0000000e0000000) + lVar22;
    t = *(word *)((long)Truths + lVar12);
    local_c0->Truth = t;
    puVar9 = (uint *)Bdc_SpfdHashLookup(p,0xc000013,t);
    *puVar9 = uVar14;
    Vec_WrdPush(local_c8,t);
    Vec_IntPush(local_d0,0);
    pVVar7 = local_d8;
    local_c0 = local_c0 + 1;
    lVar22 = lVar22 + 0x100000000;
    lVar12 = lVar12 + 8;
    uVar14 = uVar14 + 1;
  } while (lVar12 != 0x30);
  Vec_IntPush(local_d8,7);
  printf("Added %d + %d + 0 = %d. Total = %8d.\n",0,0,0,(ulong)uVar14);
  local_a8 = 0;
  do {
    lVar12 = local_a8;
    uVar4 = 0;
    lVar22 = local_a8 + 1;
    local_98 = local_a8;
    do {
      local_a8 = lVar22;
      uVar18 = uVar4 + 1;
      local_f8 = 0;
      local_b0 = uVar4;
      local_78 = uVar18;
      do {
        if (local_f8 < uVar4 || local_f8 + uVar4 != lVar12) {
          local_f8 = local_f8 + 1;
        }
        else {
          if (((((long)pVVar7->nSize <= (long)uVar4) ||
               (uVar10 = (ulong)(uint)pVVar7->nSize, uVar10 <= uVar18)) || (uVar10 <= local_f8)) ||
             (local_50 = local_f8 + 1, uVar10 <= local_50)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar8 = pVVar7->pArray;
          lVar12 = (long)piVar8[uVar4];
          iVar2 = piVar8[uVar18];
          lVar22 = (long)piVar8[local_f8];
          iVar19 = piVar8[local_f8 + 1];
          iVar3 = clock_gettime(3,&local_e8);
          if (iVar3 < 0) {
            local_b8 = 1;
          }
          else {
            lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_e8.tv_nsec),8);
            local_b8 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_e8.tv_sec * -1000000;
          }
          lVar13 = (long)iVar2 * 0x18;
          lVar1 = (long)iVar19 * 0x18;
          printf("Trying %7d  x %7d.  ",
                 (ulong)(uint)((int)((ulong)(lVar13 + lVar12 * -0x18) >> 3) * -0x55555555),
                 (ulong)(uint)((int)((ulong)(lVar1 + lVar22 * -0x18) >> 3) * -0x55555555));
          uVar4 = local_b0;
          if (lVar13 != lVar12 * 0x18 &&
              SBORROW8(lVar13,lVar12 * 0x18) == lVar13 + lVar12 * -0x18 < 0) {
            pBVar17 = p + lVar12;
            local_58 = p + iVar2;
            local_70 = p + lVar22;
            local_48 = p + iVar19;
            local_68 = lVar1;
            local_60 = lVar22 * 0x18;
            do {
              if (local_60 < local_68) {
                local_40 = (ulong)(((uint)((int)pBVar17 - (int)p) >> 3) * -0x55555555 & 0x1fffffff);
                pBVar20 = local_70;
                local_90 = pBVar17;
                do {
                  if ((uVar4 < local_f8) || (pBVar17 < pBVar20)) {
                    local_38 = ((ulong)((long)pBVar20 - (long)p) >> 3) * -0x5555555500000000 &
                               0x1fffffff00000000;
                    uVar14 = 0;
                    iVar2 = 0;
                    uVar4 = 0;
                    local_88 = pBVar20;
                    do {
                      uVar15 = (uint)uVar4;
                      uVar10 = (long)(int)-(uVar15 & 1) ^ pBVar17->Truth;
                      uVar21 = (long)(iVar2 >> 0x1f) ^ pBVar20->Truth;
                      uVar18 = uVar21 & uVar10;
                      if (uVar15 == 4) {
                        uVar18 = uVar21 ^ uVar10;
                      }
                      uVar10 = -(ulong)((uint)uVar18 & 1);
                      if (uVar18 != uVar10) {
                        uVar10 = uVar10 ^ uVar18;
                        piVar8 = Bdc_SpfdHashLookup(p,0xc000013,uVar10);
                        pBVar17 = local_90;
                        pBVar20 = local_88;
                        if (piVar8 != (int *)0x0) {
                          local_c0->Truth = uVar10;
                          *(ulong *)local_c0 =
                               (ulong)(((uint)uVar18 & 1) << 0x1e) |
                               (uVar4 >> 2) << 0x3e | uVar14 & 0x20000000 | local_38 |
                               (ulong)((uint)(uVar4 >> 1) & 1) << 0x3d |
                               (*(ulong *)local_c0 & 0x8000000080000000) + local_40;
                          *piVar8 = (int)((ulong)((long)local_c0 - (long)p) >> 3) * -0x55555555;
                          pBVar16 = local_c0 + 1;
                          Vec_WrdPush(local_c8,uVar10);
                          Vec_IntPush(local_d0,(int)local_a8);
                          pBVar17 = local_90;
                          pBVar20 = local_88;
                          local_c0 = pBVar16;
                          if ((long)pBVar16 - (long)p == 6000000000) {
                            printf("Reached limit of %d functions.\n",250000000);
                            pVVar5 = local_c8;
                            pVVar7 = local_d0;
                            goto LAB_00551633;
                          }
                        }
                      }
                      uVar4 = (ulong)(uVar15 + 1);
                      iVar2 = iVar2 + 0x40000000;
                      uVar14 = uVar14 + 0x20000000;
                    } while (uVar15 + 1 != 5);
                  }
                  pBVar20 = pBVar20 + 1;
                  uVar4 = local_b0;
                } while (pBVar20 < local_48);
              }
              pBVar17 = pBVar17 + 1;
            } while (pBVar17 < local_58);
          }
          printf("Added %d + %d + 1 = %d. Total = %8d.   ",uVar4 & 0xffffffff,local_f8,local_a8,
                 (ulong)(uint)((int)((ulong)((long)local_c0 - (long)p) >> 3) * -0x55555555));
          iVar19 = 3;
          iVar2 = clock_gettime(3,&local_e8);
          lVar12 = local_98;
          pVVar7 = local_d8;
          if (iVar2 < 0) {
            lVar22 = -1;
          }
          else {
            lVar22 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
          }
          lVar22 = lVar22 + local_b8;
          Abc_Print(iVar19,"%s =","Time");
          Abc_Print(iVar19,"%9.2f sec\n",(double)lVar22 / 1000000.0);
          local_f8 = local_50;
          uVar18 = local_78;
        }
      } while (local_f8 != 6);
      uVar4 = uVar18;
      lVar22 = local_a8;
    } while (uVar18 != 6);
    Vec_IntPush(pVVar7,(int)((ulong)((long)local_c0 - (long)p) >> 3) * -0x55555555);
  } while (local_a8 != 6);
  iVar19 = 3;
  iVar2 = clock_gettime(3,&local_e8);
  if (iVar2 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_e8.tv_nsec / 1000 + local_e8.tv_sec * 1000000;
  }
  lVar12 = lVar12 + local_a0;
  Abc_Print(iVar19,"%s =","Time");
  Abc_Print(iVar19,"%9.2f sec\n",(double)lVar12 / 1000000.0);
  pFVar11 = fopen("func6v6n_bin.txt","wb");
  pVVar5 = local_c8;
  fwrite(local_c8->pArray,8,(long)local_c8->nSize,pFVar11);
  fclose(pFVar11);
  pFVar11 = fopen("func6v6nW_bin.txt","wb");
  pVVar7 = local_d0;
  fwrite(local_d0->pArray,4,(long)local_d0->nSize,pFVar11);
  fclose(pFVar11);
LAB_00551633:
  __ptr = local_d8;
  if (local_d8->pArray != (int *)0x0) {
    free(local_d8->pArray);
  }
  free(__ptr);
  free(p);
  *local_80 = pVVar7;
  return pVVar5;
}

Assistant:

Vec_Wrd_t * Bdc_SpfdDecomposeTest__( Vec_Int_t ** pvWeights )
{
//    int nFuncs = 8000000; // the number of functions to compute
//    int nSize  = 2777111; // the hash table size to use
//    int Limit  = 6;
    
//    int nFuncs = 51000000; // the number of functions to compute
//    int nSize  = 50331653; // the hash table size to use
//    int Limit  = 6;
    
    int nFuncs = 250000000; // the number of functions to compute
    int nSize  = 201326611; // the hash table size to use
    int Limit  = 6;

    int * pPlace, i, n, m, k, s, fCompl;
    abctime clk = Abc_Clock(), clk2;
    Vec_Int_t * vStops;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vWeights;
    Bdc_Ent_t * p, * q, * pBeg0, * pEnd0, * pBeg1, * pEnd1, * pThis0, * pThis1;
    word t0, t1, t;
    assert( nSize <= nFuncs );

    printf( "Allocating %.2f MB of internal memory.\n", 1.0*sizeof(Bdc_Ent_t)*nFuncs/(1<<20) );

    p = (Bdc_Ent_t *)calloc( nFuncs, sizeof(Bdc_Ent_t) );
    memset( p, 255, sizeof(Bdc_Ent_t) );
    p->iList = 0;
    for ( q = p; q < p+nFuncs; q++ )
       q->iList = 0;
    q = p + 1;
    printf( "Added %d + %d + 0 = %d. Total = %8d.\n", 0, 0, 0, (int)(q-p) );

    vTruths  = Vec_WrdStart( nFuncs );
    vWeights = Vec_IntStart( nFuncs );
    Vec_WrdClear( vTruths );
    Vec_IntClear( vWeights );

    // create elementary vars
    vStops = Vec_IntAlloc( 10 );
    Vec_IntPush( vStops, 1 );
    for ( i = 0; i < 6; i++ )
    {
        q->iFan0 = BDC_TERM;
        q->iFan1 = i;
        q->Truth = Truths[i];
        pPlace   = Bdc_SpfdHashLookup( p, nSize, q->Truth );
        *pPlace  = q-p;
        q++;
        Vec_WrdPush( vTruths, Truths[i] );
        Vec_IntPush( vWeights, 0 );
    }
    Vec_IntPush( vStops, 7 );
    printf( "Added %d + %d + 0 = %d. Total = %8d.\n", 0, 0, 0, (int)(q-p) );

    // create gates
    for ( n = 0; n < Limit; n++ )
    {
        // try previous
        for ( k = 0; k < Limit; k++ )
        for ( m = 0; m < Limit; m++ )
        {
            if ( k + m != n || k > m )
                continue;
            // set the start and stop
            pBeg0 = p + Vec_IntEntry( vStops, k );
            pEnd0 = p + Vec_IntEntry( vStops, k+1 );
            // set the start and stop
            pBeg1 = p + Vec_IntEntry( vStops, m );
            pEnd1 = p + Vec_IntEntry( vStops, m+1 );

            clk2 = Abc_Clock();
            printf( "Trying %7d  x %7d.  ", (int)(pEnd0-pBeg0), (int)(pEnd1-pBeg1) );
            for ( pThis0 = pBeg0; pThis0 < pEnd0; pThis0++ )
            for ( pThis1 = pBeg1; pThis1 < pEnd1; pThis1++ )
            if ( k < m || pThis1 > pThis0 )
//            if ( n < 5 || Bdc_SpfdCheckOverlap(p, pThis0, pThis1) )
            for ( s = 0; s < 5; s++ )
            {
                t0 = (s&1)      ? ~pThis0->Truth : pThis0->Truth;
                t1 = ((s>>1)&1) ? ~pThis1->Truth : pThis1->Truth;
                t  = ((s>>2)&1) ? t0 ^ t1 : t0 & t1;
                fCompl = t & 1;
                if ( fCompl )
                    t = ~t;
                if ( t == 0 )
                    continue;
                pPlace = Bdc_SpfdHashLookup( p, nSize, t );
                if ( pPlace == NULL )
                    continue;
                q->iFan0   = pThis0-p;
                q->fCompl0 = s&1;
                q->iFan1   = pThis1-p;
                q->fCompl1 = (s>>1)&1;
                q->fExor   = (s>>2)&1;
                q->Truth   = t;
                q->fCompl  = fCompl;
                *pPlace = q-p;
                q++;
                Vec_WrdPush( vTruths, t );
//                Vec_IntPush( vWeights, n == 5 ? n : n+1 );
                Vec_IntPush( vWeights, n+1 );
                if ( q-p == nFuncs )
                {
                    printf( "Reached limit of %d functions.\n", nFuncs );
                    goto finish;
                }
            }
            printf( "Added %d + %d + 1 = %d. Total = %8d.   ", k, m, n+1, (int)(q-p) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }
        Vec_IntPush( vStops, q-p );
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );


    {
        FILE * pFile = fopen( "func6v6n_bin.txt", "wb" );
        fwrite( Vec_WrdArray(vTruths), sizeof(word), Vec_WrdSize(vTruths), pFile );
        fclose( pFile );
    }
    {
        FILE * pFile = fopen( "func6v6nW_bin.txt", "wb" );
        fwrite( Vec_IntArray(vWeights), sizeof(int), Vec_IntSize(vWeights), pFile );
        fclose( pFile );
    }


finish:
    Vec_IntFree( vStops );
    free( p );

    *pvWeights = vWeights;
//    Vec_WrdFree( vTruths );
    return vTruths;
}